

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O2

void __thiscall GainBuckets::delCell(GainBuckets *this,int gain,const_iterator iter)

{
  Bucket *this_00;
  _List_node_base *p_Var1;
  
  this->num_elems_ = this->num_elems_ - 1;
  this_00 = operator[][abi_cxx11_(this,gain);
  std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::erase(this_00,iter);
  if (this->best_gain_ == gain) {
    while (p_Var1 = (_List_node_base *)operator[][abi_cxx11_(this,gain),
          (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var1->_M_next)->_M_impl).
          _M_node.super__List_node_base._M_next == p_Var1) {
      if (this->max_gain_ + this->best_gain_ == 0) {
        this->best_gain_ = -0x80000000;
        return;
      }
      gain = this->best_gain_ + -1;
      this->best_gain_ = gain;
    }
  }
  return;
}

Assistant:

void GainBuckets::delCell(int gain, GainBuckets::Bucket::const_iterator iter) {
  --num_elems_;
  (*this)[gain].erase(iter);
  if (best_gain_ == gain)
    while ((*this)[best_gain_].empty()) {
      if (best_gain_ == -(int)max_gain_) {
        best_gain_ = INT_MIN;
        break;
      }
      --best_gain_;
    }
}